

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O1

bool __thiscall
irr::scene::COBJMeshFileLoader::retrieveVertexIndices
          (COBJMeshFileLoader *this,c8 *vertexData,s32 *idx,c8 *bufEnd,u32 vbsize,u32 vtsize,
          u32 vnsize)

{
  uint uVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  u32 uVar9;
  ulong uVar10;
  bool bVar11;
  byte local_48 [24];
  
  pbVar2 = (byte *)vertexData;
  if (vertexData != bufEnd) {
    do {
      vertexData = (c8 *)pbVar2;
      if ((4 < (byte)*vertexData - 9) && (*vertexData != 0x20)) break;
      pbVar2 = (byte *)vertexData + 1;
      vertexData = bufEnd;
    } while (pbVar2 != (byte *)bufEnd);
  }
  if (vertexData == bufEnd) {
LAB_001b67fd:
    bVar11 = true;
  }
  else {
    uVar8 = 0;
    uVar6 = 0;
    do {
      bVar11 = uVar8 < 0x10;
      if (!bVar11) {
        return bVar11;
      }
      bVar7 = *vertexData;
      if ((int)(char)bVar7 - 0x30U < 10) {
LAB_001b66ac:
        uVar10 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        local_48[uVar10] = bVar7;
      }
      else if (bVar7 < 0x2d) {
        if ((bVar7 == 0) || (bVar7 == 0x20)) {
LAB_001b66e6:
          local_48[uVar8] = 0;
          uVar10 = (ulong)((local_48[0] - 0x2b & 0xfd) == 0);
          bVar7 = local_48[uVar10];
          uVar8 = 0;
          if ((byte)(bVar7 - 0x30) < 10) {
            pbVar2 = local_48 + uVar10 + 1;
            uVar8 = 0;
            bVar3 = false;
            do {
              uVar4 = (uint)(byte)(bVar7 - 0x30) + uVar8 * 10;
              if (uVar4 < uVar8) {
                bVar3 = true;
                uVar8 = 0xffffffff;
              }
              if (!bVar3) {
                uVar8 = uVar4;
              }
              bVar7 = *pbVar2;
              pbVar2 = pbVar2 + 1;
            } while ((byte)(bVar7 - 0x30) < 10);
          }
          uVar4 = -uVar8;
          if (local_48[0] != 0x2d) {
            uVar4 = uVar8;
          }
          uVar1 = (local_48[0] == 0x2d) + 0x7fffffff;
          if (-1 < (int)uVar8) {
            uVar1 = uVar4;
          }
          iVar5 = (int)uVar6;
          idx[uVar6] = uVar1;
          uVar9 = 0xffffffff;
          if ((((-1 < (int)uVar1) || (uVar9 = vbsize, iVar5 == 0)) || (uVar9 = vnsize, iVar5 == 2))
             || (uVar9 = vtsize, iVar5 == 1)) {
            idx[uVar6] = uVar1 + uVar9;
          }
          local_48[0] = 0;
          uVar4 = iVar5 + 1;
          if (*vertexData != 0x2f) {
            if (uVar4 < 3) {
              memset(idx + uVar4,0xff,(ulong)(1 - iVar5) * 4 + 4);
            }
            goto LAB_001b67fd;
          }
          uVar8 = 0;
          if (2 < uVar4) {
            uVar4 = 0;
          }
          uVar6 = (ulong)uVar4;
        }
      }
      else {
        if (bVar7 == 0x2f) goto LAB_001b66e6;
        if (bVar7 == 0x2d) goto LAB_001b66ac;
      }
      vertexData = (c8 *)((byte *)vertexData + 1);
    } while (vertexData != bufEnd);
  }
  return bVar11;
}

Assistant:

const c8 *COBJMeshFileLoader::goFirstWord(const c8 *buf, const c8 *const bufEnd, bool acrossNewlines)
{
	// skip space characters
	if (acrossNewlines)
		while ((buf != bufEnd) && core::isspace(*buf))
			++buf;
	else
		while ((buf != bufEnd) && core::isspace(*buf) && (*buf != '\n'))
			++buf;

	return buf;
}